

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sljitNativeX86_64.c
# Opt level: O0

sljit_s32 sljit_emit_return(sljit_compiler *compiler,sljit_s32 op,sljit_s32 src,sljit_sw srcw)

{
  sljit_s32 sVar1;
  int iVar2;
  int iVar3;
  undefined1 *puVar4;
  int local_44;
  char *local_40;
  sljit_u8 *inst;
  sljit_s32 size;
  sljit_s32 tmp;
  sljit_s32 i;
  sljit_sw srcw_local;
  sljit_s32 src_local;
  sljit_s32 op_local;
  sljit_compiler *compiler_local;
  
  if (compiler->error == 0) {
    sVar1 = emit_mov_before_return(compiler,op,src,srcw);
    if (sVar1 == 0) {
      if (0 < compiler->local_size) {
        if (compiler->local_size < 0x80) {
          puVar4 = (undefined1 *)ensure_buf(compiler,5);
          if (puVar4 == (undefined1 *)0x0) {
            return compiler->error;
          }
          *puVar4 = 4;
          compiler->size = compiler->size + 4;
          puVar4[1] = 0x48;
          puVar4[2] = 0x83;
          puVar4[3] = 0xc4;
          puVar4[4] = (char)compiler->local_size;
        }
        else {
          puVar4 = (undefined1 *)ensure_buf(compiler,8);
          if (puVar4 == (undefined1 *)0x0) {
            return compiler->error;
          }
          *puVar4 = 7;
          compiler->size = compiler->size + 7;
          puVar4[1] = 0x48;
          puVar4[2] = 0x81;
          puVar4[3] = 0xc4;
          sljit_unaligned_store_s32(puVar4 + 4,compiler->local_size);
        }
      }
      iVar3 = compiler->scratches;
      for (size = 8; size <= iVar3; size = size + 1) {
        iVar2 = 1;
        if (7 < ""[size]) {
          iVar2 = 2;
        }
        puVar4 = (undefined1 *)ensure_buf(compiler,(long)(iVar2 + 1));
        if (puVar4 == (undefined1 *)0x0) {
          return compiler->error;
        }
        *puVar4 = (char)iVar2;
        compiler->size = (long)iVar2 + compiler->size;
        local_40 = puVar4 + 1;
        if (7 < ""[size]) {
          local_40 = puVar4 + 2;
          puVar4[1] = 'A';
        }
        *local_40 = ""[size] + 'X';
      }
      if (compiler->saveds < 6) {
        local_44 = 0xe - compiler->saveds;
      }
      else {
        local_44 = 8;
      }
      for (size = local_44; size < 0xe; size = size + 1) {
        iVar3 = 1;
        if (7 < ""[size]) {
          iVar3 = 2;
        }
        puVar4 = (undefined1 *)ensure_buf(compiler,(long)(iVar3 + 1));
        if (puVar4 == (undefined1 *)0x0) {
          return compiler->error;
        }
        *puVar4 = (char)iVar3;
        compiler->size = (long)iVar3 + compiler->size;
        local_40 = puVar4 + 1;
        if (7 < ""[size]) {
          local_40 = puVar4 + 2;
          puVar4[1] = 'A';
        }
        *local_40 = ""[size] + 'X';
      }
      puVar4 = (undefined1 *)ensure_buf(compiler,2);
      if (puVar4 == (undefined1 *)0x0) {
        compiler_local._4_4_ = compiler->error;
      }
      else {
        *puVar4 = 1;
        compiler->size = compiler->size + 1;
        puVar4[1] = 0xc3;
        compiler_local._4_4_ = 0;
      }
    }
    else {
      compiler_local._4_4_ = compiler->error;
    }
  }
  else {
    compiler_local._4_4_ = compiler->error;
  }
  return compiler_local._4_4_;
}

Assistant:

SLJIT_API_FUNC_ATTRIBUTE sljit_s32 sljit_emit_return(struct sljit_compiler *compiler, sljit_s32 op, sljit_s32 src, sljit_sw srcw)
{
	sljit_s32 i, tmp, size;
	sljit_u8 *inst;

	CHECK_ERROR();
	CHECK(check_sljit_emit_return(compiler, op, src, srcw));

	FAIL_IF(emit_mov_before_return(compiler, op, src, srcw));

#ifdef _WIN64
	/* Restore xmm6 register: movaps xmm6, [rsp + 0x20] */
	if (compiler->fscratches >= 6 || compiler->fsaveds >= 1) {
		inst = (sljit_u8*)ensure_buf(compiler, 1 + 5);
		FAIL_IF(!inst);
		INC_SIZE(5);
		*inst++ = GROUP_0F;
		sljit_unaligned_store_s32(inst, 0x20247428);
	}
#endif

	if (compiler->local_size > 0) {
		if (compiler->local_size <= 127) {
			inst = (sljit_u8*)ensure_buf(compiler, 1 + 4);
			FAIL_IF(!inst);
			INC_SIZE(4);
			*inst++ = REX_W;
			*inst++ = GROUP_BINARY_83;
			*inst++ = MOD_REG | ADD | 4;
			*inst = compiler->local_size;
		}
		else {
			inst = (sljit_u8*)ensure_buf(compiler, 1 + 7);
			FAIL_IF(!inst);
			INC_SIZE(7);
			*inst++ = REX_W;
			*inst++ = GROUP_BINARY_81;
			*inst++ = MOD_REG | ADD | 4;
			sljit_unaligned_store_s32(inst, compiler->local_size);
		}
	}

	tmp = compiler->scratches;
	for (i = SLJIT_FIRST_SAVED_REG; i <= tmp; i++) {
		size = reg_map[i] >= 8 ? 2 : 1;
		inst = (sljit_u8*)ensure_buf(compiler, 1 + size);
		FAIL_IF(!inst);
		INC_SIZE(size);
		if (reg_map[i] >= 8)
			*inst++ = REX_B;
		POP_REG(reg_lmap[i]);
	}

	tmp = compiler->saveds < SLJIT_NUMBER_OF_SAVED_REGISTERS ? (SLJIT_S0 + 1 - compiler->saveds) : SLJIT_FIRST_SAVED_REG;
	for (i = tmp; i <= SLJIT_S0; i++) {
		size = reg_map[i] >= 8 ? 2 : 1;
		inst = (sljit_u8*)ensure_buf(compiler, 1 + size);
		FAIL_IF(!inst);
		INC_SIZE(size);
		if (reg_map[i] >= 8)
			*inst++ = REX_B;
		POP_REG(reg_lmap[i]);
	}

	inst = (sljit_u8*)ensure_buf(compiler, 1 + 1);
	FAIL_IF(!inst);
	INC_SIZE(1);
	RET();
	return SLJIT_SUCCESS;
}